

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[19],kj::String&,char_const(&)[14],kj::String&,char_const(&)[23],kj::String&,char_const(&)[15],kj::String&,char_const(&)[6]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [19],
          String *params_2,char (*params_3) [14],String *params_4,char (*params_5) [23],
          String *params_6,char (*params_7) [15],String *params_8,char (*params_9) [6])

{
  char *pcVar1;
  Branch *pBVar2;
  char *pcVar3;
  ArrayPtr<const_char> *params_9_00;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_60 = toCharSequence<char_const(&)[19]>((char (*) [19])params);
  pcVar1 = *(char **)(*params_1 + 8);
  local_70.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_70.ptr = *(char **)*params_1;
  }
  pcVar3 = (char *)0x0;
  local_70.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_70.size_ = (size_t)pcVar3;
  }
  local_80 = toCharSequence<char_const(&)[14]>((char (*) [14])params_2);
  pcVar1 = *(char **)(*params_3 + 8);
  local_90.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_90.ptr = *(char **)*params_3;
  }
  local_90.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_90.size_ = (size_t)pcVar3;
  }
  local_a0 = toCharSequence<char_const(&)[23]>((char (*) [23])params_4);
  pcVar1 = *(char **)(*params_5 + 8);
  local_b0.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_b0.ptr = *(char **)*params_5;
  }
  local_b0.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_b0.size_ = (size_t)pcVar3;
  }
  local_c0 = toCharSequence<char_const(&)[15]>((char (*) [15])params_6);
  pBVar2 = *(Branch **)(*params_7 + 8);
  local_40.ptr = (char *)pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_40.ptr = *(char **)*params_7;
  }
  local_40.size_ = (size_t)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_40.size_ = (size_t)pcVar3;
  }
  params_9_00 = (ArrayPtr<const_char> *)0x1a2c38;
  local_50 = toCharSequence<char_const(&)[6]>((char (*) [6])params_8);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)this,(StringTree *)&local_60,&local_70,&local_80,
             &local_90,&local_a0,&local_b0,&local_c0,&local_40,&local_50,params_9_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}